

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O3

void __thiscall
TidyConfigParser::toggleCheck
          (TidyConfigParser *this,string *groupName,string *checkName,CheckStatus status)

{
  pointer pcVar1;
  TidyConfigParser *this_00;
  int iVar2;
  undefined8 extraout_RAX;
  size_type sVar3;
  _Alloc_hider _Var4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  TidyKind kind;
  bool bVar5;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string local_a8;
  TidyConfigParser *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  
  if (checkName->_M_string_length == 0) {
    local_58._M_dataplus._M_p = (groupName->_M_dataplus)._M_p;
    local_58._M_string_length = groupName->_M_string_length;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x48;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_a8,
               (v11 *)"Empty check name in group {0}, you can toggle the whole group with {0}-*",
               fmt_00,args_00);
    reportWarning(this,&local_a8);
    local_58.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
    _Var4._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return;
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    pcVar1 = (groupName->_M_dataplus)._M_p;
    local_80 = this;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + groupName->_M_string_length);
    _Var4._M_p = local_78._M_dataplus._M_p;
    if (local_78._M_string_length != 0) {
      sVar3 = 0;
      do {
        iVar2 = tolower((int)_Var4._M_p[sVar3]);
        _Var4._M_p[sVar3] = (char)iVar2;
        sVar3 = sVar3 + 1;
      } while (local_78._M_string_length != sVar3);
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_78,"synthesis");
    bVar5 = true;
    kind = Synthesis;
    if ((iVar2 != 0) &&
       (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_78,"synth"), kind = Synthesis, iVar2 != 0)) {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_78,"style");
      bVar5 = iVar2 == 0;
      kind = Style;
    }
    this_00 = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      local_58._M_dataplus._M_p = (groupName->_M_dataplus)._M_p;
      local_58._M_string_length = groupName->_M_string_length;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_58;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x17;
      ::fmt::v11::vformat_abi_cxx11_(&local_a8,(v11 *)"Group {} does not exist",fmt_01,args_01);
      reportErrorAndExit(this_00,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        (size_t)(local_58.field_2._M_allocated_capacity + 1));
      }
      _Unwind_Resume(extraout_RAX);
    }
    formatCheckName(&local_a8,checkName);
    bVar5 = TidyConfig::toggleCheck(&this_00->config,kind,&local_a8,status);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(size_t)(local_a8.field_2._M_allocated_capacity + 1)
                     );
    }
    if (bVar5) {
      return;
    }
    local_a8._M_dataplus._M_p = (checkName->_M_dataplus)._M_p;
    local_a8._M_string_length = checkName->_M_string_length;
    local_a8.field_2._M_allocated_capacity = (size_type)(groupName->_M_dataplus)._M_p;
    local_a8.field_2._8_8_ = groupName->_M_string_length;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_a8;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x28;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_58,(v11 *)"Check name {} does not exist in group {}",fmt,args);
    reportWarning(local_80,&local_58);
    _Var4._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
  }
  operator_delete(_Var4._M_p,(size_t)(local_58.field_2._M_allocated_capacity + 1));
  return;
}

Assistant:

void TidyConfigParser::toggleCheck(const std::string& groupName, const std::string& checkName,
                                   TidyConfig::CheckStatus status) {
    if (checkName.empty()) {
        reportWarning(fmt::format(
            "Empty check name in group {0}, you can toggle the whole group with {0}-*", groupName));
        return;
    }

    auto kind = slang::tidyKindFromStr(groupName);
    if (!kind)
        reportErrorAndExit(fmt::format("Group {} does not exist", groupName));
    bool found = config.toggleCheck(kind.value(), formatCheckName(checkName), status);

    if (!found)
        reportWarning(
            fmt::format("Check name {} does not exist in group {}", checkName, groupName));
}